

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::print_preamble_header(char *out_buff,size_t out_buff_size)

{
  int iVar1;
  ulong local_20;
  long pos;
  size_t out_buff_size_local;
  char *out_buff_local;
  
  if (out_buff_size != 0) {
    *out_buff = '\0';
    local_20 = 0;
    if (((g_preamble_date & 1) != 0) && (out_buff_size != 0)) {
      iVar1 = snprintf(out_buff,out_buff_size,"date       ");
      local_20 = (ulong)iVar1;
    }
    if (((g_preamble_time & 1) != 0) && (local_20 < out_buff_size)) {
      iVar1 = snprintf(out_buff + local_20,out_buff_size - local_20,"time         ");
      local_20 = (long)iVar1 + local_20;
    }
    if (((g_preamble_uptime & 1) != 0) && (local_20 < out_buff_size)) {
      iVar1 = snprintf(out_buff + local_20,out_buff_size - local_20,"( uptime  ) ");
      local_20 = (long)iVar1 + local_20;
    }
    if (((g_preamble_thread & 1) != 0) && (local_20 < out_buff_size)) {
      iVar1 = snprintf(out_buff + local_20,out_buff_size - local_20,"[%-*s]",0x10," thread name/id")
      ;
      local_20 = (long)iVar1 + local_20;
    }
    if (((g_preamble_file & 1) != 0) && (local_20 < out_buff_size)) {
      iVar1 = snprintf(out_buff + local_20,out_buff_size - local_20,"%*s:line  ",0x17,"file");
      local_20 = (long)iVar1 + local_20;
    }
    if (((g_preamble_verbose & 1) != 0) && (local_20 < out_buff_size)) {
      iVar1 = snprintf(out_buff + local_20,out_buff_size - local_20,"   v");
      local_20 = (long)iVar1 + local_20;
    }
    if (((g_preamble_pipe & 1) != 0) && (local_20 < out_buff_size)) {
      snprintf(out_buff + local_20,out_buff_size - local_20,"| ");
    }
  }
  return;
}

Assistant:

static void print_preamble_header(char* out_buff, size_t out_buff_size)
	{
		if (out_buff_size == 0) { return; }
		out_buff[0] = '\0';
		long pos = 0;
		if (g_preamble_date && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "date       ");
		}
		if (g_preamble_time && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "time         ");
		}
		if (g_preamble_uptime && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "( uptime  ) ");
		}
		if (g_preamble_thread && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "[%-*s]", LOGURU_THREADNAME_WIDTH, " thread name/id");
		}
		if (g_preamble_file && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "%*s:line  ", LOGURU_FILENAME_WIDTH, "file");
		}
		if (g_preamble_verbose && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "   v");
		}
		if (g_preamble_pipe && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "| ");
		}
	}